

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderLayeredFramebufferStencil::iterate
          (GeometryShaderLayeredFramebufferStencil *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  pointer_____offset_0x10___ *ppuVar9;
  long lVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar local_1371;
  long local_1370;
  GeometryShaderLayeredFramebufferStencil *local_1368;
  GLuint *local_1360;
  GLuint *local_1358;
  ulong local_1350;
  char *gs_code;
  char *fs_code;
  uchar ref_data [128];
  uchar result_data [128];
  uchar slice_null_data [128];
  undefined1 local_11b8 [120];
  ios_base local_1140 [264];
  uchar slice_1_data [1024];
  uchar slice_4_data [1024];
  uchar slice_3_data [1024];
  uchar slice_2_data [1024];
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar3);
  fs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(1, 1, 1, 1);\n}\n"
  ;
  gs_code = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout (points)                            in;\nlayout (triangle_strip, max_vertices = 16) out;\n\nvoid main()\n{\n    for (int n = 0; n < 4; ++n)\n    {\n        gl_Position = vec4(1, -1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        gl_Position = vec4(1,  1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        gl_Position = vec4(-1, -1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        gl_Position = vec4(-1,  1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        EndPrimitive();\n    }\n\n}\n"
  ;
  slice_null_data[0x70] = '\0';
  slice_null_data[0x71] = '\0';
  slice_null_data[0x72] = '\0';
  slice_null_data[0x73] = '\0';
  slice_null_data[0x74] = '\0';
  slice_null_data[0x75] = '\0';
  slice_null_data[0x76] = '\0';
  slice_null_data[0x77] = '\0';
  slice_null_data[0x78] = '\0';
  slice_null_data[0x79] = '\0';
  slice_null_data[0x7a] = '\0';
  slice_null_data[0x7b] = '\0';
  slice_null_data[0x7c] = '\0';
  slice_null_data[0x7d] = '\0';
  slice_null_data[0x7e] = '\0';
  slice_null_data[0x7f] = '\0';
  slice_null_data[0x60] = '\0';
  slice_null_data[0x61] = '\0';
  slice_null_data[0x62] = '\0';
  slice_null_data[99] = '\0';
  slice_null_data[100] = '\0';
  slice_null_data[0x65] = '\0';
  slice_null_data[0x66] = '\0';
  slice_null_data[0x67] = '\0';
  slice_null_data[0x68] = '\0';
  slice_null_data[0x69] = '\0';
  slice_null_data[0x6a] = '\0';
  slice_null_data[0x6b] = '\0';
  slice_null_data[0x6c] = '\0';
  slice_null_data[0x6d] = '\0';
  slice_null_data[0x6e] = '\0';
  slice_null_data[0x6f] = '\0';
  slice_null_data[0x50] = '\0';
  slice_null_data[0x51] = '\0';
  slice_null_data[0x52] = '\0';
  slice_null_data[0x53] = '\0';
  slice_null_data[0x54] = '\0';
  slice_null_data[0x55] = '\0';
  slice_null_data[0x56] = '\0';
  slice_null_data[0x57] = '\0';
  slice_null_data[0x58] = '\0';
  slice_null_data[0x59] = '\0';
  slice_null_data[0x5a] = '\0';
  slice_null_data[0x5b] = '\0';
  slice_null_data[0x5c] = '\0';
  slice_null_data[0x5d] = '\0';
  slice_null_data[0x5e] = '\0';
  slice_null_data[0x5f] = '\0';
  slice_null_data[0x40] = '\0';
  slice_null_data[0x41] = '\0';
  slice_null_data[0x42] = '\0';
  slice_null_data[0x43] = '\0';
  slice_null_data[0x44] = '\0';
  slice_null_data[0x45] = '\0';
  slice_null_data[0x46] = '\0';
  slice_null_data[0x47] = '\0';
  slice_null_data[0x48] = '\0';
  slice_null_data[0x49] = '\0';
  slice_null_data[0x4a] = '\0';
  slice_null_data[0x4b] = '\0';
  slice_null_data[0x4c] = '\0';
  slice_null_data[0x4d] = '\0';
  slice_null_data[0x4e] = '\0';
  slice_null_data[0x4f] = '\0';
  slice_null_data[0x30] = '\0';
  slice_null_data[0x31] = '\0';
  slice_null_data[0x32] = '\0';
  slice_null_data[0x33] = '\0';
  slice_null_data[0x34] = '\0';
  slice_null_data[0x35] = '\0';
  slice_null_data[0x36] = '\0';
  slice_null_data[0x37] = '\0';
  slice_null_data[0x38] = '\0';
  slice_null_data[0x39] = '\0';
  slice_null_data[0x3a] = '\0';
  slice_null_data[0x3b] = '\0';
  slice_null_data[0x3c] = '\0';
  slice_null_data[0x3d] = '\0';
  slice_null_data[0x3e] = '\0';
  slice_null_data[0x3f] = '\0';
  slice_null_data[0x20] = '\0';
  slice_null_data[0x21] = '\0';
  slice_null_data[0x22] = '\0';
  slice_null_data[0x23] = '\0';
  slice_null_data[0x24] = '\0';
  slice_null_data[0x25] = '\0';
  slice_null_data[0x26] = '\0';
  slice_null_data[0x27] = '\0';
  slice_null_data[0x28] = '\0';
  slice_null_data[0x29] = '\0';
  slice_null_data[0x2a] = '\0';
  slice_null_data[0x2b] = '\0';
  slice_null_data[0x2c] = '\0';
  slice_null_data[0x2d] = '\0';
  slice_null_data[0x2e] = '\0';
  slice_null_data[0x2f] = '\0';
  slice_null_data[0x10] = '\0';
  slice_null_data[0x11] = '\0';
  slice_null_data[0x12] = '\0';
  slice_null_data[0x13] = '\0';
  slice_null_data[0x14] = '\0';
  slice_null_data[0x15] = '\0';
  slice_null_data[0x16] = '\0';
  slice_null_data[0x17] = '\0';
  slice_null_data[0x18] = '\0';
  slice_null_data[0x19] = '\0';
  slice_null_data[0x1a] = '\0';
  slice_null_data[0x1b] = '\0';
  slice_null_data[0x1c] = '\0';
  slice_null_data[0x1d] = '\0';
  slice_null_data[0x1e] = '\0';
  slice_null_data[0x1f] = '\0';
  slice_null_data[0] = '\0';
  slice_null_data[1] = '\0';
  slice_null_data[2] = '\0';
  slice_null_data[3] = '\0';
  slice_null_data[4] = '\0';
  slice_null_data[5] = '\0';
  slice_null_data[6] = '\0';
  slice_null_data[7] = '\0';
  slice_null_data[8] = '\0';
  slice_null_data[9] = '\0';
  slice_null_data[10] = '\0';
  slice_null_data[0xb] = '\0';
  slice_null_data[0xc] = '\0';
  slice_null_data[0xd] = '\0';
  slice_null_data[0xe] = '\0';
  slice_null_data[0xf] = '\0';
  memset(slice_1_data,0,0x400);
  memset(slice_2_data,0,0x400);
  memset(slice_3_data,0,0x400);
  memset(slice_4_data,0,0x400);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0x4e1);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    GVar4 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar4;
    GVar4 = (**(code **)(lVar10 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_gs_id = GVar4;
    GVar4 = (**(code **)(lVar10 + 0x3c8))();
    this->m_po_id = GVar4;
    GVar4 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar4;
    dVar5 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar5,"Could not create shader or program objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x4ea);
    bVar2 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&fs_code,
                       this->m_gs_id,1,&gs_code,this->m_vs_id,1,&TestCaseBase::m_boilerplate_vs_code
                       ,(bool *)0x0);
    if (bVar2) {
      (**(code **)(lVar10 + 0x708))(1,&this->m_vao_id);
      (**(code **)(lVar10 + 0xd8))(this->m_vao_id);
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Could not create & bind a vertex array object.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x4f7);
      memset(slice_1_data,2,0x400);
      memset(slice_2_data,1,0x400);
      memset(slice_3_data,0,0x400);
      memset(slice_4_data,0,0x400);
      local_1358 = &this->m_to_a_id;
      (**(code **)(lVar10 + 0x6f8))(1);
      (**(code **)(lVar10 + 0x6f8))(1,&this->m_to_b_id);
      (**(code **)(lVar10 + 0xb8))(0x8c1a,this->m_to_a_id);
      local_1370 = lVar10;
      (**(code **)(lVar10 + 0x1320))(0x8c1a,0,0x8058,8,4,4,0,0x1908,0x1401,0);
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,0,8,4,1,0x1908,0x1401,slice_null_data);
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,1,8,4,1,0x1908,0x1401,slice_null_data);
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,2,8,4,1,0x1908,0x1401,slice_null_data);
      uVar8 = 0;
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,3,8,4,1,0x1908,0x1401,slice_null_data);
      dVar5 = (**(code **)(local_1370 + 0x800))();
      glu::checkError(dVar5,"Could not set up texture object A.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x519);
      (**(code **)(local_1370 + 0xb8))(0x8c1a,this->m_to_b_id);
      (**(code **)(local_1370 + 0x1320))(0x8c1a,0,0x8cad,8,4,4,0,0x84f9,0x8dad,0);
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,0,8,4,1,0x84f9,0x8dad,slice_1_data);
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,1,8,4,1,0x84f9,0x8dad,slice_2_data);
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,2,8,4,1,0x84f9,0x8dad,slice_3_data);
      lVar10 = local_1370;
      (**(code **)(local_1370 + 0x13c0))(0x8c1a,0,0,0,3,8,4,1,0x84f9,0x8dad,slice_4_data);
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Could not set up texture object B.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x52c);
      (**(code **)(lVar10 + 0x4e8))(0xb71);
      (**(code **)(lVar10 + 0x5e0))(0xb90);
      (**(code **)(lVar10 + 0x12c8))(0x201,0,0xffffffff);
      local_1360 = &this->m_fbo_id;
      (**(code **)(lVar10 + 0x6d0))(1);
      (**(code **)(lVar10 + 0x78))(0x8ca9,this->m_fbo_id);
      (**(code **)(lVar10 + 0x690))(0x8ca9,0x8ce0,this->m_to_a_id);
      (**(code **)(lVar10 + 0x690))(0x8ca9,0x821a,this->m_to_b_id,0);
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Could not set up draw framebuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x53c);
      local_1368 = this;
      (**(code **)(lVar10 + 0x1680))();
      (**(code **)(lVar10 + 0x538))(0,0,1);
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"Draw call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x542);
      while( true ) {
        ref_data[0x70] = '\0';
        ref_data[0x71] = '\0';
        ref_data[0x72] = '\0';
        ref_data[0x73] = '\0';
        ref_data[0x74] = '\0';
        ref_data[0x75] = '\0';
        ref_data[0x76] = '\0';
        ref_data[0x77] = '\0';
        ref_data[0x78] = '\0';
        ref_data[0x79] = '\0';
        ref_data[0x7a] = '\0';
        ref_data[0x7b] = '\0';
        ref_data[0x7c] = '\0';
        ref_data[0x7d] = '\0';
        ref_data[0x7e] = '\0';
        ref_data[0x7f] = '\0';
        ref_data[0x60] = '\0';
        ref_data[0x61] = '\0';
        ref_data[0x62] = '\0';
        ref_data[99] = '\0';
        ref_data[100] = '\0';
        ref_data[0x65] = '\0';
        ref_data[0x66] = '\0';
        ref_data[0x67] = '\0';
        ref_data[0x68] = '\0';
        ref_data[0x69] = '\0';
        ref_data[0x6a] = '\0';
        ref_data[0x6b] = '\0';
        ref_data[0x6c] = '\0';
        ref_data[0x6d] = '\0';
        ref_data[0x6e] = '\0';
        ref_data[0x6f] = '\0';
        ref_data[0x50] = '\0';
        ref_data[0x51] = '\0';
        ref_data[0x52] = '\0';
        ref_data[0x53] = '\0';
        ref_data[0x54] = '\0';
        ref_data[0x55] = '\0';
        ref_data[0x56] = '\0';
        ref_data[0x57] = '\0';
        ref_data[0x58] = '\0';
        ref_data[0x59] = '\0';
        ref_data[0x5a] = '\0';
        ref_data[0x5b] = '\0';
        ref_data[0x5c] = '\0';
        ref_data[0x5d] = '\0';
        ref_data[0x5e] = '\0';
        ref_data[0x5f] = '\0';
        ref_data[0x40] = '\0';
        ref_data[0x41] = '\0';
        ref_data[0x42] = '\0';
        ref_data[0x43] = '\0';
        ref_data[0x44] = '\0';
        ref_data[0x45] = '\0';
        ref_data[0x46] = '\0';
        ref_data[0x47] = '\0';
        ref_data[0x48] = '\0';
        ref_data[0x49] = '\0';
        ref_data[0x4a] = '\0';
        ref_data[0x4b] = '\0';
        ref_data[0x4c] = '\0';
        ref_data[0x4d] = '\0';
        ref_data[0x4e] = '\0';
        ref_data[0x4f] = '\0';
        ref_data[0x30] = '\0';
        ref_data[0x31] = '\0';
        ref_data[0x32] = '\0';
        ref_data[0x33] = '\0';
        ref_data[0x34] = '\0';
        ref_data[0x35] = '\0';
        ref_data[0x36] = '\0';
        ref_data[0x37] = '\0';
        ref_data[0x38] = '\0';
        ref_data[0x39] = '\0';
        ref_data[0x3a] = '\0';
        ref_data[0x3b] = '\0';
        ref_data[0x3c] = '\0';
        ref_data[0x3d] = '\0';
        ref_data[0x3e] = '\0';
        ref_data[0x3f] = '\0';
        ref_data[0x20] = '\0';
        ref_data[0x21] = '\0';
        ref_data[0x22] = '\0';
        ref_data[0x23] = '\0';
        ref_data[0x24] = '\0';
        ref_data[0x25] = '\0';
        ref_data[0x26] = '\0';
        ref_data[0x27] = '\0';
        ref_data[0x28] = '\0';
        ref_data[0x29] = '\0';
        ref_data[0x2a] = '\0';
        ref_data[0x2b] = '\0';
        ref_data[0x2c] = '\0';
        ref_data[0x2d] = '\0';
        ref_data[0x2e] = '\0';
        ref_data[0x2f] = '\0';
        ref_data[0x10] = '\0';
        ref_data[0x11] = '\0';
        ref_data[0x12] = '\0';
        ref_data[0x13] = '\0';
        ref_data[0x14] = '\0';
        ref_data[0x15] = '\0';
        ref_data[0x16] = '\0';
        ref_data[0x17] = '\0';
        ref_data[0x18] = '\0';
        ref_data[0x19] = '\0';
        ref_data[0x1a] = '\0';
        ref_data[0x1b] = '\0';
        ref_data[0x1c] = '\0';
        ref_data[0x1d] = '\0';
        ref_data[0x1e] = '\0';
        ref_data[0x1f] = '\0';
        ref_data[0] = '\0';
        ref_data[1] = '\0';
        ref_data[2] = '\0';
        ref_data[3] = '\0';
        ref_data[4] = '\0';
        ref_data[5] = '\0';
        ref_data[6] = '\0';
        ref_data[7] = '\0';
        ref_data[8] = '\0';
        ref_data[9] = '\0';
        ref_data[10] = '\0';
        ref_data[0xb] = '\0';
        ref_data[0xc] = '\0';
        ref_data[0xd] = '\0';
        ref_data[0xe] = '\0';
        ref_data[0xf] = '\0';
        result_data[0x70] = '\0';
        result_data[0x71] = '\0';
        result_data[0x72] = '\0';
        result_data[0x73] = '\0';
        result_data[0x74] = '\0';
        result_data[0x75] = '\0';
        result_data[0x76] = '\0';
        result_data[0x77] = '\0';
        result_data[0x78] = '\0';
        result_data[0x79] = '\0';
        result_data[0x7a] = '\0';
        result_data[0x7b] = '\0';
        result_data[0x7c] = '\0';
        result_data[0x7d] = '\0';
        result_data[0x7e] = '\0';
        result_data[0x7f] = '\0';
        result_data[0x60] = '\0';
        result_data[0x61] = '\0';
        result_data[0x62] = '\0';
        result_data[99] = '\0';
        result_data[100] = '\0';
        result_data[0x65] = '\0';
        result_data[0x66] = '\0';
        result_data[0x67] = '\0';
        result_data[0x68] = '\0';
        result_data[0x69] = '\0';
        result_data[0x6a] = '\0';
        result_data[0x6b] = '\0';
        result_data[0x6c] = '\0';
        result_data[0x6d] = '\0';
        result_data[0x6e] = '\0';
        result_data[0x6f] = '\0';
        result_data[0x50] = '\0';
        result_data[0x51] = '\0';
        result_data[0x52] = '\0';
        result_data[0x53] = '\0';
        result_data[0x54] = '\0';
        result_data[0x55] = '\0';
        result_data[0x56] = '\0';
        result_data[0x57] = '\0';
        result_data[0x58] = '\0';
        result_data[0x59] = '\0';
        result_data[0x5a] = '\0';
        result_data[0x5b] = '\0';
        result_data[0x5c] = '\0';
        result_data[0x5d] = '\0';
        result_data[0x5e] = '\0';
        result_data[0x5f] = '\0';
        result_data[0x40] = '\0';
        result_data[0x41] = '\0';
        result_data[0x42] = '\0';
        result_data[0x43] = '\0';
        result_data[0x44] = '\0';
        result_data[0x45] = '\0';
        result_data[0x46] = '\0';
        result_data[0x47] = '\0';
        result_data[0x48] = '\0';
        result_data[0x49] = '\0';
        result_data[0x4a] = '\0';
        result_data[0x4b] = '\0';
        result_data[0x4c] = '\0';
        result_data[0x4d] = '\0';
        result_data[0x4e] = '\0';
        result_data[0x4f] = '\0';
        result_data[0x30] = '\0';
        result_data[0x31] = '\0';
        result_data[0x32] = '\0';
        result_data[0x33] = '\0';
        result_data[0x34] = '\0';
        result_data[0x35] = '\0';
        result_data[0x36] = '\0';
        result_data[0x37] = '\0';
        result_data[0x38] = '\0';
        result_data[0x39] = '\0';
        result_data[0x3a] = '\0';
        result_data[0x3b] = '\0';
        result_data[0x3c] = '\0';
        result_data[0x3d] = '\0';
        result_data[0x3e] = '\0';
        result_data[0x3f] = '\0';
        result_data[0x20] = '\0';
        result_data[0x21] = '\0';
        result_data[0x22] = '\0';
        result_data[0x23] = '\0';
        result_data[0x24] = '\0';
        result_data[0x25] = '\0';
        result_data[0x26] = '\0';
        result_data[0x27] = '\0';
        result_data[0x28] = '\0';
        result_data[0x29] = '\0';
        result_data[0x2a] = '\0';
        result_data[0x2b] = '\0';
        result_data[0x2c] = '\0';
        result_data[0x2d] = '\0';
        result_data[0x2e] = '\0';
        result_data[0x2f] = '\0';
        result_data[0x10] = '\0';
        result_data[0x11] = '\0';
        result_data[0x12] = '\0';
        result_data[0x13] = '\0';
        result_data[0x14] = '\0';
        result_data[0x15] = '\0';
        result_data[0x16] = '\0';
        result_data[0x17] = '\0';
        result_data[0x18] = '\0';
        result_data[0x19] = '\0';
        result_data[0x1a] = '\0';
        result_data[0x1b] = '\0';
        result_data[0x1c] = '\0';
        result_data[0x1d] = '\0';
        result_data[0x1e] = '\0';
        result_data[0x1f] = '\0';
        result_data[0] = '\0';
        result_data[1] = '\0';
        result_data[2] = '\0';
        result_data[3] = '\0';
        result_data[4] = '\0';
        result_data[5] = '\0';
        result_data[6] = '\0';
        result_data[7] = '\0';
        result_data[8] = '\0';
        result_data[9] = '\0';
        result_data[10] = '\0';
        result_data[0xb] = '\0';
        result_data[0xc] = '\0';
        result_data[0xd] = '\0';
        result_data[0xe] = '\0';
        result_data[0xf] = '\0';
        (**(code **)(lVar10 + 0x78))(0x8ca8,*local_1360);
        (**(code **)(lVar10 + 0x6b8))(0x8ca8,0x8ce0,*local_1358,0,uVar8);
        (**(code **)(lVar10 + 0x690))(0x8ca8,0x821a,0,0);
        dVar5 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar5,"Could not set up read framebuffer.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x554);
        iVar3 = (**(code **)(lVar10 + 0x170))(0x8ca8);
        if (iVar3 != 0x8cd5) break;
        lVar6 = 0;
        do {
          ref_data[lVar6] = -((uint)uVar8 < 2);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x80);
        puVar11 = result_data;
        local_1350 = uVar8;
        (**(code **)(lVar10 + 0x1220))(0,0,8,4,0x1908,0x1401,puVar11);
        dVar5 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar5,"glReadPixels() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x571);
        puVar12 = ref_data;
        lVar10 = 0;
        do {
          lVar6 = 0;
          iVar3 = 0;
          do {
            if (*(int *)(puVar12 + lVar6) != *(int *)(puVar11 + lVar6)) {
              local_11b8._0_8_ =
                   ((local_1368->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log
              ;
              poVar1 = (ostringstream *)(local_11b8 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(x=",3);
              std::ostream::operator<<(poVar1,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," y=",3);
              std::ostream::operator<<(poVar1,(int)lVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"): Rendered data ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
              local_1371 = puVar11[lVar6];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              local_1371 = puVar11[lVar6 + 1];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              local_1371 = puVar11[lVar6 + 2];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              local_1371 = puVar11[lVar6 + 3];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1," is different from reference data ",0x22);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
              local_1371 = puVar12[lVar6];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              local_1371 = puVar12[lVar6 + 1];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              local_1371 = puVar12[lVar6 + 2];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              local_1371 = puVar12[lVar6 + 3];
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)&local_1371,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_11b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_1140);
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Data comparison failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                         ,0x585);
              goto LAB_00d08568;
            }
            iVar3 = iVar3 + 1;
            lVar6 = lVar6 + 4;
          } while ((int)lVar6 != 0x20);
          lVar10 = lVar10 + 1;
          puVar11 = puVar11 + 0x20;
          puVar12 = puVar12 + 0x20;
        } while (lVar10 != 4);
        uVar7 = (int)local_1350 + 1;
        uVar8 = (ulong)uVar7;
        lVar10 = local_1370;
        if (uVar7 == 4) {
          tcu::TestContext::setTestResult
                    ((local_1368->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          return STOP;
        }
      }
      local_11b8._0_8_ =
           ((local_1368->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_11b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Read FBO is incomplete: ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_11b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_1140);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Read FBO is incomplete.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                 ,0x55e);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Could not build test program object",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                 ,0x4f0);
    }
LAB_00d08568:
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredFramebufferStencil::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

/* Test-wide definitions */
#define N_TEXTURE_COMPONENTS (4)
#define TEXTURE_DEPTH (4)
#define TEXTURE_HEIGHT (4)
#define TEXTURE_WIDTH (8)

	/* Fragment shader code */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1, 1, 1, 1);\n"
						  "}\n";

	/* Geometry shader code */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "layout (points)                            in;\n"
						  "layout (triangle_strip, max_vertices = 16) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    for (int n = 0; n < 4; ++n)\n"
						  "    {\n"
						  "        gl_Position = vec4(1, -1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Position = vec4(1,  1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Position = vec4(-1, -1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Position = vec4(-1,  1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        EndPrimitive();\n"
						  "    }\n"
						  "\n"
						  "}\n";

	/* General variables */
	int n = 0;

	unsigned char slice_null_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 1 /* byte  per texel */] = { 0 };
	unsigned char slice_1_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };
	unsigned char slice_2_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };
	unsigned char slice_3_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };
	unsigned char slice_4_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };

	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create shader & program objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader or program objects");

	/* Build test program object */
	if (!buildProgram(m_po_id, m_fs_id, 1 /* parts */, &fs_code, m_gs_id, 1 /* parts */, &gs_code, m_vs_id,
					  1 /* parts */, &m_boilerplate_vs_code))
	{
		TCU_FAIL("Could not build test program object");
	}

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create & bind a vertex array object.");

	/* Configure slice data */
	for (n = 0; n < TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */; ++n)
	{
		/* We are okay with depth data being filled with glitch, but need the stencil data to be
		 * as per test spec. To keep code simple, we do not differentiate between floating-point and
		 * stencil part.
		 */
		slice_1_data[n] = 2;
		slice_2_data[n] = 1;

		/* Slices 3 and 4 should be filled with 0s */
		slice_3_data[n] = 0;
		slice_4_data[n] = 0;
	} /* for (all pixels making up slices) */

	/* Set up texture objects */
	gl.genTextures(1, &m_to_a_id);
	gl.genTextures(1, &m_to_b_id);

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_a_id);
	gl.texImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH,
				  0 /* border */, GL_RGBA, GL_UNSIGNED_BYTE, NULL);

	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object A.");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_b_id);
	gl.texImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, GL_DEPTH32F_STENCIL8, TEXTURE_WIDTH, TEXTURE_HEIGHT,
				  TEXTURE_DEPTH, 0 /* border */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV, NULL);

	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_1_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_2_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_3_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_4_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object B.");

	/* Set up depth tests */
	gl.disable(GL_DEPTH_TEST);

	/* Set up stencil tests */
	gl.enable(GL_STENCIL_TEST);
	gl.stencilFunc(GL_LESS, 0, /* reference value */ 0xFFFFFFFF /* mask */);

	/* Set up framebuffer objects */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_a_id, 0 /* level */);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, m_to_b_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up draw framebuffer.");

	/* Issue the draw call. */
	gl.useProgram(m_po_id);
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed.");

	/* Check the results */
	for (n = 0; n < 4 /* layers */; ++n)
	{
		glw::GLenum   fbo_completeness													 = GL_NONE;
		int			  m																	 = 0;
		unsigned char ref_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS]	= { 0 };
		unsigned char result_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS] = { 0 };
		int			  x																	 = 0;
		int			  y																	 = 0;

		/* Configure the read framebuffer */
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_a_id, 0 /* level */, n);
		gl.framebufferTexture(GL_READ_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, 0 /* texture */, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up read framebuffer.");

		/* Verify read framebuffer is considered complete */
		fbo_completeness = gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER);

		if (fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Read FBO is incomplete: "
							   << "[" << fbo_completeness << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL("Read FBO is incomplete.");
		}

		/* Build reference data */
		for (m = 0; m < TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS; ++m)
		{
			if (n < 2)
			{
				ref_data[m] = 255;
			}
			else
			{
				ref_data[m] = 0;
			}
		} /* for (all reference pixels) */

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, result_data);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");

		for (y = 0; y < TEXTURE_HEIGHT; ++y)
		{
			int			   pixel_size = N_TEXTURE_COMPONENTS;
			int			   row_size   = pixel_size * TEXTURE_WIDTH;
			unsigned char* ref_row	= ref_data + y * row_size;
			unsigned char* result_row = result_data + y * row_size;

			for (x = 0; x < TEXTURE_WIDTH; ++x)
			{
				if (memcmp(ref_row, result_row, pixel_size) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "(x=" << x << " y=" << y << "): Rendered data "
									   << "(" << result_row[0] << ", " << result_row[1] << ", " << result_row[2] << ", "
									   << result_row[3] << ")"
									   << " is different from reference data "
									   << "(" << ref_row[0] << ", " << ref_row[1] << ", " << ref_row[2] << ", "
									   << ref_row[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (memcmp(ref_row, result_row, pixel_size) != 0) */

				ref_row += pixel_size;
				result_row += pixel_size;
			} /* for (all pixels in a row) */
		}	 /* for (all pixels) */
	}		  /* for (all layers) */

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;

#undef N_TEXTURE_COMPONENTS
#undef TEXTURE_DEPTH
#undef TEXTURE_HEIGHT
#undef TEXTURE_WIDTH
}